

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall ArchiveEntry::ArchiveEntry(ArchiveEntry *this,ArchiveEntry *param_1)

{
  ArchiveEntry *param_1_local;
  ArchiveEntry *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->RunName,(string *)&param_1->RunName);
  memcpy(&this->ExperimentValue,&param_1->ExperimentValue,0x119);
  return;
}

Assistant:

static void WriteHeader(std::ostream& str)
	{
		str << "GroupName,RunName,Failure,ExperimentValue,ExperimentValueScale,FirstRanDate,TotalSamplesCollected,AverageBaseline,";
		str << "MinBaseline,MinBaselineTimeSinceEpoch,";
		str << "MinStatSize,MinStatMean,MinStatVariance,MinStatStandardDeviation,MinStatSkewness,MinStatKurtosis,";
		str << "MinStatMin,MinStatMax,";
		str << "MaxBaseline,MaxBaselineTimeSinceEpoch,";
		str << "MaxStatSize,MaxStatMean,MaxStatVariance,MaxStatStandardDeviation,MaxStatSkewness,MaxStatKurtosis,";
		str << "MaxStatMin,MaxStatMax,";
		str << "CurrentBaseline,CurrentBaselineTimeSinceEpoch,";
		str << "CurrentStatSize,CurrentStatMean,CurrentStatVariance,CurrentStatStandardDeviation,CurrentStatSkewness,CurrentStatKurtosis,";
		str << "CurrentStatMin,CurrentStatMax" << std::endl;
	}